

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlNode * __thiscall TiXmlNode::LinkEndChild(TiXmlNode *this,TiXmlNode *node)

{
  int iVar1;
  TiXmlDocument *pTVar2;
  TiXmlDocument *pTVar3;
  bool bVar4;
  TiXmlNode *node_local;
  TiXmlNode *this_local;
  
  bVar4 = true;
  if (node->parent != (TiXmlNode *)0x0) {
    bVar4 = node->parent == this;
  }
  if (!bVar4) {
    __assert_fail("node->parent == 0 || node->parent == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                  ,0xbc,"TiXmlNode *TiXmlNode::LinkEndChild(TiXmlNode *)");
  }
  pTVar2 = GetDocument(node);
  bVar4 = true;
  if (pTVar2 != (TiXmlDocument *)0x0) {
    pTVar2 = GetDocument(node);
    pTVar3 = GetDocument(this);
    bVar4 = pTVar2 == pTVar3;
  }
  if (!bVar4) {
    __assert_fail("node->GetDocument() == 0 || node->GetDocument() == this->GetDocument()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                  ,0xbd,"TiXmlNode *TiXmlNode::LinkEndChild(TiXmlNode *)");
  }
  iVar1 = Type(node);
  if (iVar1 == 0) {
    if (node != (TiXmlNode *)0x0) {
      (*(node->super_TiXmlBase)._vptr_TiXmlBase[1])();
    }
    pTVar2 = GetDocument(this);
    if (pTVar2 != (TiXmlDocument *)0x0) {
      pTVar2 = GetDocument(this);
      TiXmlDocument::SetError(pTVar2,0xf,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN)
      ;
    }
    this_local = (TiXmlNode *)0x0;
  }
  else {
    node->parent = this;
    node->prev = this->lastChild;
    node->next = (TiXmlNode *)0x0;
    if (this->lastChild == (TiXmlNode *)0x0) {
      this->firstChild = node;
    }
    else {
      this->lastChild->next = node;
    }
    this->lastChild = node;
    this_local = node;
  }
  return this_local;
}

Assistant:

TiXmlNode* TiXmlNode::LinkEndChild( TiXmlNode* node )
{
	assert( node->parent == 0 || node->parent == this );
	assert( node->GetDocument() == 0 || node->GetDocument() == this->GetDocument() );

	if ( node->Type() == TiXmlNode::TINYXML_DOCUMENT )
	{
		delete node;
		if ( GetDocument() ) 
			GetDocument()->SetError( TIXML_ERROR_DOCUMENT_TOP_ONLY, 0, 0, TIXML_ENCODING_UNKNOWN );
		return 0;
	}

	node->parent = this;

	node->prev = lastChild;
	node->next = 0;

	if ( lastChild )
		lastChild->next = node;
	else
		firstChild = node;			// it was an empty list.

	lastChild = node;
	return node;
}